

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_do(connectdata *conn,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  void *pvVar2;
  Curl_easy *pCVar3;
  undefined4 *puVar4;
  bool bVar5;
  imapstate iVar6;
  _Bool *done_00;
  _Bool _Var7;
  char cVar8;
  CURLcode CVar9;
  int iVar10;
  curl_off_t cVar11;
  size_t sVar12;
  char *pcVar13;
  _Bool *p_Var14;
  Curl_easy *data;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  char *value;
  char *name;
  size_t local_48;
  Curl_easy *local_40;
  _Bool *local_38;
  
  *done = false;
  local_40 = conn->data;
  pvVar2 = (local_40->req).protop;
  pcVar17 = (local_40->state).up.path;
  lVar15 = 1;
  pcVar13 = pcVar17;
  local_38 = done;
  do {
    pcVar16 = pcVar13;
    pcVar13 = pcVar16 + 1;
    _Var7 = imap_is_bchar(pcVar16[1]);
    lVar15 = lVar15 + -1;
  } while (_Var7);
  if (lVar15 == 0) {
    *(undefined8 *)((long)pvVar2 + 8) = 0;
  }
  else {
    pcVar17 = pcVar17 + 1;
    if (*pcVar16 != '/') {
      pcVar16 = pcVar13;
    }
    CVar9 = Curl_urldecode(local_40,pcVar17,(long)pcVar16 - (long)pcVar17,
                           (char **)((long)pvVar2 + 8),(size_t *)0x0,REJECT_CTRL);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
  }
  while( true ) {
    cVar8 = *pcVar13;
    if (cVar8 != ';') break;
    pcVar17 = pcVar13 + 1;
    pcVar16 = pcVar13 + 2;
    sVar12 = 0;
    pcVar13 = pcVar17;
    while( true ) {
      if (pcVar16[-1] == '\0') {
        return CURLE_URL_MALFORMAT;
      }
      if (pcVar16[-1] == '=') break;
      pcVar16 = pcVar16 + 1;
      sVar12 = sVar12 + 1;
      pcVar13 = pcVar13 + 1;
    }
    CVar9 = Curl_urldecode(local_40,pcVar17,sVar12,&name,(size_t *)0x0,REJECT_CTRL);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    sVar12 = 0xffffffffffffffff;
    do {
      pcVar17 = pcVar13 + 1;
      pcVar13 = pcVar13 + 1;
      _Var7 = imap_is_bchar(*pcVar17);
      sVar12 = sVar12 + 1;
    } while (_Var7);
    CVar9 = Curl_urldecode(local_40,pcVar16,sVar12,&value,&local_48,REJECT_CTRL);
    if (CVar9 != CURLE_OK) {
      (*Curl_cfree)(name);
      return CVar9;
    }
    iVar10 = Curl_strcasecompare(name,"UIDVALIDITY");
    if ((iVar10 == 0) || (*(long *)((long)pvVar2 + 0x10) != 0)) {
      iVar10 = Curl_strcasecompare(name,"UID");
      if ((iVar10 == 0) || (*(long *)((long)pvVar2 + 0x18) != 0)) {
        iVar10 = Curl_strcasecompare(name,"MAILINDEX");
        if ((iVar10 == 0) || (*(long *)((long)pvVar2 + 0x20) != 0)) {
          iVar10 = Curl_strcasecompare(name,"SECTION");
          if ((iVar10 == 0) || (*(long *)((long)pvVar2 + 0x28) != 0)) {
            iVar10 = Curl_strcasecompare(name,"PARTIAL");
            if ((iVar10 == 0) || (*(long *)((long)pvVar2 + 0x30) != 0)) {
              (*Curl_cfree)(name);
              (*Curl_cfree)(value);
              return CURLE_URL_MALFORMAT;
            }
            if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
              value[local_48 - 1] = '\0';
            }
            *(char **)((long)pvVar2 + 0x30) = value;
          }
          else {
            if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
              value[local_48 - 1] = '\0';
            }
            *(char **)((long)pvVar2 + 0x28) = value;
          }
        }
        else {
          if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
            value[local_48 - 1] = '\0';
          }
          *(char **)((long)pvVar2 + 0x20) = value;
        }
      }
      else {
        if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
          value[local_48 - 1] = '\0';
        }
        *(char **)((long)pvVar2 + 0x18) = value;
      }
    }
    else {
      if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
        value[local_48 - 1] = '\0';
      }
      *(char **)((long)pvVar2 + 0x10) = value;
    }
    value = (char *)0x0;
    (*Curl_cfree)(name);
    (*Curl_cfree)(value);
  }
  if (((*(long *)((long)pvVar2 + 8) != 0) && (*(long *)((long)pvVar2 + 0x18) == 0)) &&
     (*(long *)((long)pvVar2 + 0x20) == 0)) {
    curl_url_get((local_40->state).uh,CURLUPART_QUERY,(char **)((long)pvVar2 + 0x38),0x40);
    cVar8 = *pcVar13;
  }
  done_00 = local_38;
  if (cVar8 != '\0') {
    return CURLE_URL_MALFORMAT;
  }
  pCVar3 = conn->data;
  pcVar17 = (pCVar3->set).str[6];
  if (pcVar17 != (char *)0x0) {
    pvVar2 = (pCVar3->req).protop;
    CVar9 = Curl_urldecode(pCVar3,pcVar17,0,(char **)((long)pvVar2 + 0x40),(size_t *)0x0,REJECT_CTRL
                          );
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    pcVar17 = *(char **)((long)pvVar2 + 0x40);
    pcVar13 = pcVar17;
    for (; *pcVar17 != '\0'; pcVar17 = pcVar17 + 1) {
      if (*pcVar17 == ' ') {
        pcVar17 = (*Curl_cstrdup)(pcVar17);
        *(char **)((long)pvVar2 + 0x48) = pcVar17;
        *pcVar13 = '\0';
        if (*(long *)((long)pvVar2 + 0x48) == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        break;
      }
      pcVar13 = pcVar13 + 1;
    }
  }
  pCVar3 = conn->data;
  (pCVar3->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar3,0);
  Curl_pgrsSetDownloadCounter(pCVar3,0);
  Curl_pgrsSetUploadSize(pCVar3,-1);
  Curl_pgrsSetDownloadSize(pCVar3,-1);
  pCVar3 = conn->data;
  puVar4 = (undefined4 *)(pCVar3->req).protop;
  if (((pCVar3->set).field_0x97b & 0x10) != 0) {
    *puVar4 = 1;
  }
  *done_00 = false;
  if ((((*(char **)(puVar4 + 2) == (char *)0x0) ||
       (pcVar17 = (conn->proto).imapc.mailbox, pcVar17 == (char *)0x0)) ||
      (iVar10 = Curl_strcasecompare(*(char **)(puVar4 + 2),pcVar17), iVar10 == 0)) ||
     (((*(char **)(puVar4 + 4) != (char *)0x0 &&
       (pcVar17 = (conn->proto).imapc.mailbox_uidvalidity, pcVar17 != (char *)0x0)) &&
      (iVar10 = Curl_strcasecompare(*(char **)(puVar4 + 4),pcVar17), iVar10 == 0)))) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
  }
  data = conn->data;
  if ((((data->set).field_0x97b & 0x20) != 0) || ((pCVar3->set).mimepost.kind != MIMEKIND_NONE)) {
    pvVar2 = (data->req).protop;
    if (*(long *)((long)pvVar2 + 8) == 0) {
      pcVar17 = "Cannot APPEND without a mailbox.";
      goto LAB_00128030;
    }
    if ((data->set).mimepost.kind == MIMEKIND_NONE) {
      cVar11 = (data->state).infilesize;
    }
    else {
      part = &(data->set).mimepost;
      puVar1 = &(data->set).mimepost.flags;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      curl_mime_headers(part,(data->set).headers,0);
      CVar9 = Curl_mime_prepare_headers(part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      pcVar17 = Curl_checkheaders(conn,"Mime-Version");
      if ((pcVar17 == (char *)0x0) &&
         (CVar9 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0"),
         CVar9 != CURLE_OK)) {
        return CVar9;
      }
      CVar9 = Curl_mime_rewind(part);
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      cVar11 = Curl_mime_size(part);
      (data->state).infilesize = cVar11;
      (data->state).fread_func = Curl_mime_read;
      (data->state).in = part;
    }
    if (cVar11 < 0) {
      Curl_failf(data,"Cannot APPEND with unknown input file size\n");
      return CURLE_UPLOAD_FAILED;
    }
    pcVar17 = imap_atom(*(char **)((long)pvVar2 + 8),false);
    if (pcVar17 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar9 = imap_sendf(conn,"APPEND %s (\\Seen) {%ld}",pcVar17,(data->state).infilesize);
    (*Curl_cfree)(pcVar17);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    iVar6 = IMAP_APPEND;
LAB_001281c3:
    (conn->proto).imapc.state = iVar6;
    goto LAB_001281ff;
  }
  if (*(long *)(puVar4 + 0x10) == 0) {
    if (!bVar5) {
      if (*(long *)(puVar4 + 2) != 0) {
        if ((*(long *)(puVar4 + 6) == 0) && (*(long *)(puVar4 + 8) == 0)) {
          lVar15 = *(long *)(puVar4 + 0xe);
          goto joined_r0x00128136;
        }
        goto LAB_0012813c;
      }
      goto LAB_001281ec;
    }
    if ((*(long *)(puVar4 + 6) == 0) && (*(long *)(puVar4 + 8) == 0)) {
      if (*(long *)(puVar4 + 0xe) == 0) goto LAB_001281ec;
      CVar9 = imap_perform_search(conn);
    }
    else {
      CVar9 = imap_perform_fetch(conn);
    }
  }
  else {
    if (!bVar5) {
      lVar15 = *(long *)(puVar4 + 2);
joined_r0x00128136:
      if (lVar15 != 0) {
LAB_0012813c:
        pvVar2 = (data->req).protop;
        (*Curl_cfree)((conn->proto).imapc.mailbox);
        (conn->proto).imapc.mailbox = (char *)0x0;
        (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
        (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
        pcVar17 = *(char **)((long)pvVar2 + 8);
        if (pcVar17 == (char *)0x0) {
          data = conn->data;
          pcVar17 = "Cannot SELECT without a mailbox.";
LAB_00128030:
          Curl_failf(data,pcVar17);
          return CURLE_URL_MALFORMAT;
        }
        pcVar17 = imap_atom(pcVar17,false);
        if (pcVar17 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        CVar9 = imap_sendf(conn,"SELECT %s",pcVar17);
        (*Curl_cfree)(pcVar17);
        if (CVar9 != CURLE_OK) {
          return CVar9;
        }
        iVar6 = IMAP_SELECT;
        goto LAB_001281c3;
      }
    }
LAB_001281ec:
    CVar9 = imap_perform_list(conn);
  }
  if (CVar9 != CURLE_OK) {
    return CVar9;
  }
LAB_001281ff:
  p_Var14 = done_00;
  CVar9 = imap_multi_statemach(conn,done_00);
  if ((CVar9 == CURLE_OK) && (CVar9 = CURLE_OK, *done_00 == true)) {
    imap_dophase_done(conn,SUB81(p_Var14,0));
  }
  return CVar9;
}

Assistant:

static CURLcode imap_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(conn);
  if(result)
    return result;

  result = imap_regular_transfer(conn, done);

  return result;
}